

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O2

bool __thiscall
XmlModelSerialiserPrivate::writeXml(XmlModelSerialiserPrivate *this,QXmlStreamWriter *writer)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int *piVar8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  int local_8c;
  QString roleString;
  QVariant roleData;
  QArrayDataPointer<char16_t> local_48;
  
  if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
      m_constModel == (QAbstractItemModel *)0x0) {
    bVar3 = 0;
  }
  else {
    if (this->m_printStartDocument == true) {
      QXmlStreamWriter::writeStartDocument();
    }
    roleData.d.data.shared = (PrivateShared *)0x0;
    roleData.d.data._8_8_ = anon_var_dwarf_a7b7f;
    roleData.d.data._16_8_ = 9;
    roleString.d.d = (Data *)0x0;
    roleString.d.ptr = (char16_t *)0x0;
    roleString.d.size = 0;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&roleString.d);
    roleData.d.data._forAlignment = -NAN;
    roleData.d.data._8_8_ = 0;
    roleData.d.data._16_8_ = 0;
    writeXmlElement(this,writer,(QModelIndex *)&roleData);
    roleData.d.data.shared = (PrivateShared *)0x0;
    roleData.d.data._8_8_ = anon_var_dwarf_a7b89;
    roleData.d.data._16_8_ = 10;
    roleString.d.d = (Data *)0x0;
    roleString.d.ptr = (char16_t *)0x0;
    roleString.d.size = 0;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&roleString.d);
    roleData.d.data.shared = (PrivateShared *)0x0;
    roleData.d.data._8_8_ = anon_var_dwarf_a7b9f;
    roleData.d.data._16_8_ = 10;
    roleString.d.d = (Data *)0x0;
    roleString.d.ptr = (char16_t *)0x0;
    roleString.d.size = 0;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&roleString.d);
    iVar5 = 0;
    while( true ) {
      roleData.d.data._forAlignment = -NAN;
      roleData.d.data._8_8_ = 0;
      roleData.d.data._16_8_ = 0;
      iVar4 = (**(code **)(*(long *)(this->super_AbstractStringSerialiserPrivate).
                                    super_AbstractModelSerialiserPrivate.m_constModel + 0x80))();
      if (iVar4 <= iVar5) break;
      piVar6 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_rolesToSave.d.ptr;
      local_8c = iVar5;
      for (piVar8 = piVar6;
          piVar8 != piVar6 + (this->super_AbstractStringSerialiserPrivate).
                             super_AbstractModelSerialiserPrivate.m_rolesToSave.d.size;
          piVar8 = piVar8 + 1) {
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        (**(code **)(*(long *)pQVar1 + 0xa0))(&roleData,pQVar1,local_8c,1,*piVar8);
        cVar2 = ::QVariant::isNull();
        if (cVar2 == '\0') {
          AbstractStringSerialiserPrivate::saveVariant
                    (&roleString,&this->super_AbstractStringSerialiserPrivate,&roleData);
          if (roleString.d.size != 0) {
            local_c0.d = (Data *)0x0;
            local_c0.ptr = L"HeaderDataPoint";
            local_c0.size = 0xf;
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            QXmlStreamWriter::writeStartElement((QString *)writer);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            local_c0.d = (Data *)0x0;
            local_c0.ptr = L"Section";
            local_c0.size = 7;
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            iVar4 = (int)&local_48;
            QString::number(iVar4,local_8c);
            QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            local_c0.d = (Data *)0x0;
            local_c0.ptr = L"Role";
            local_c0.size = 4;
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            QString::number(iVar4,*piVar8);
            QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            local_c0.d = (Data *)0x0;
            local_c0.ptr = L"Type";
            local_c0.size = 4;
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            iVar5 = ::QVariant::typeId(&roleData);
            QString::number(iVar4,iVar5);
            QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            QXmlStreamWriter::writeCharacters((QString *)writer);
            QXmlStreamWriter::writeEndElement();
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&roleString.d);
        }
        ::QVariant::~QVariant(&roleData);
        piVar6 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_rolesToSave.d.ptr;
      }
      iVar5 = local_8c + 1;
    }
    QXmlStreamWriter::writeEndElement();
    roleData.d.data.shared = (PrivateShared *)0x0;
    roleData.d.data._8_8_ = anon_var_dwarf_a7bc9;
    roleData.d.data._16_8_ = 8;
    roleString.d.d = (Data *)0x0;
    roleString.d.ptr = (char16_t *)0x0;
    roleString.d.size = 0;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleData);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&roleString.d);
    iVar5 = 0;
    while( true ) {
      pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_constModel;
      roleData.d.data._forAlignment = -NAN;
      roleData.d.data._8_8_ = 0;
      roleData.d.data._16_8_ = 0;
      iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,(QArrayDataPointer<char16_t> *)&roleData)
      ;
      if (iVar4 <= iVar5) break;
      piVar6 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_rolesToSave.d.ptr;
      for (piVar8 = piVar6;
          piVar8 != piVar6 + (this->super_AbstractStringSerialiserPrivate).
                             super_AbstractModelSerialiserPrivate.m_rolesToSave.d.size;
          piVar8 = piVar8 + 1) {
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        (**(code **)(*(long *)pQVar1 + 0xa0))
                  ((QArrayDataPointer<char16_t> *)&roleData,pQVar1,iVar5,2,*piVar8);
        cVar2 = ::QVariant::isNull();
        if (cVar2 == '\0') {
          AbstractStringSerialiserPrivate::saveVariant
                    (&roleString,&this->super_AbstractStringSerialiserPrivate,&roleData);
          if (roleString.d.size != 0) {
            local_c0.d = (Data *)0x0;
            local_c0.ptr = L"HeaderDataPoint";
            local_c0.size = 0xf;
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            QXmlStreamWriter::writeStartElement((QString *)writer);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            local_c0.d = (Data *)0x0;
            local_c0.ptr = L"Section";
            local_c0.size = 7;
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            iVar7 = (int)&local_48;
            QString::number(iVar7,iVar5);
            QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            local_c0.d = (Data *)0x0;
            local_c0.ptr = L"Role";
            local_c0.size = 4;
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            QString::number(iVar7,*piVar8);
            QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            local_c0.d = (Data *)0x0;
            local_c0.ptr = L"Type";
            local_c0.size = 4;
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            iVar4 = ::QVariant::typeId(&roleData);
            QString::number(iVar7,iVar4);
            QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            QXmlStreamWriter::writeCharacters((QString *)writer);
            QXmlStreamWriter::writeEndElement();
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&roleString.d);
        }
        ::QVariant::~QVariant(&roleData);
        piVar6 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_rolesToSave.d.ptr;
      }
      iVar5 = iVar5 + 1;
    }
    QXmlStreamWriter::writeEndElement();
    QXmlStreamWriter::writeEndElement();
    QXmlStreamWriter::writeEndElement();
    if (this->m_printStartDocument != false) {
      QXmlStreamWriter::writeEndDocument();
    }
    bVar3 = QXmlStreamWriter::hasError();
    bVar3 = bVar3 ^ 1;
  }
  return (bool)bVar3;
}

Assistant:

bool XmlModelSerialiserPrivate::writeXml(QXmlStreamWriter &writer) const
{
    if (!m_constModel)
        return false;
    if (m_printStartDocument)
        writer.writeStartDocument();
    writer.writeStartElement(QStringLiteral("ItemModel"));
    writeXmlElement(writer);
    writer.writeStartElement(QStringLiteral("HeaderData"));
    writer.writeStartElement(QStringLiteral("Horizontal"));
    for (int i = 0; i < m_constModel->columnCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Horizontal, *singleRole);
            if (roleData.isNull())
                continue;
            const QString roleString = saveVariant(roleData);
            if (roleString.isEmpty())
                continue; // Skip unhandled types
            writer.writeStartElement(QStringLiteral("HeaderDataPoint"));
            writer.writeAttribute(QStringLiteral("Section"), QString::number(i));
            writer.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
            writer.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
            writer.writeCharacters(roleString);
            writer.writeEndElement(); // HeaderDataPoint
        }
    }
    writer.writeEndElement(); // Horizontal
    writer.writeStartElement(QStringLiteral("Vertical"));
    for (int i = 0; i < m_constModel->rowCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Vertical, *singleRole);
            if (roleData.isNull())
                continue;
            const QString roleString = saveVariant(roleData);
            if (roleString.isEmpty())
                continue; // Skip unhandled types
            writer.writeStartElement(QStringLiteral("HeaderDataPoint"));
            writer.writeAttribute(QStringLiteral("Section"), QString::number(i));
            writer.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
            writer.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
            writer.writeCharacters(roleString);
            writer.writeEndElement(); // HeaderDataPoint
        }
    }
    writer.writeEndElement(); // Vertical
    writer.writeEndElement(); // HeaderData
    writer.writeEndElement(); // ItemModel
    if (m_printStartDocument)
        writer.writeEndDocument();
    return !writer.hasError();
}